

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::WriteXMLLabels(cmCTestLaunch *this,cmXMLWriter *xml)

{
  _Base_ptr p_Var1;
  allocator local_51;
  string local_50;
  
  LoadLabels(this);
  if ((this->Labels)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmXMLWriter::Comment(xml,"Interested parties");
    std::__cxx11::string::string((string *)&local_50,"Labels",&local_51);
    cmXMLWriter::StartElement(xml,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    for (p_Var1 = (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->Labels)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      std::__cxx11::string::string((string *)&local_50,"Label",&local_51);
      cmXMLWriter::Element<std::__cxx11::string>
                (xml,&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1));
      std::__cxx11::string::~string((string *)&local_50);
    }
    cmXMLWriter::EndElement(xml);
  }
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLLabels(cmXMLWriter& xml)
{
  this->LoadLabels();
  if(!this->Labels.empty())
    {
    xml.Comment("Interested parties");
    xml.StartElement("Labels");
    for(std::set<std::string>::const_iterator li = this->Labels.begin();
        li != this->Labels.end(); ++li)
      {
      xml.Element("Label", *li);
      }
    xml.EndElement(); // Labels
    }
}